

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candela.cpp
# Opt level: O1

void candella::loop(void)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  int value;
  long lVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  backlight_adjuster adjuster;
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
  timer_queue;
  ambient_light sensor;
  action_type local_2fc;
  timespec local_2f8;
  ulong local_2e8;
  double local_2e0;
  double local_2d8;
  backlight_adjuster local_2d0;
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
  local_2b8 [8];
  _Rb_tree_node_base local_2b0;
  undefined8 local_290;
  ambient_light local_288;
  
  backlight_adjuster::backlight_adjuster(&local_2d0);
  ambient_light::ambient_light(&local_288,(string *)&DAT_00107230);
  local_2b0._M_left = &local_2b0;
  iVar8 = 0;
  local_2b0._M_color = _S_red;
  local_2b0._M_parent = (_Base_ptr)0x0;
  local_290 = 0;
  local_2b0._M_right = local_2b0._M_left;
  local_2f8.tv_sec = std::chrono::_V2::system_clock::now();
  local_2fc = BACKLIGHT_POLL;
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
  ::
  _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
            (local_2b8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&local_2f8,&local_2fc);
  local_2e8 = 0;
  value = 0;
  p_Var1 = local_2b0._M_left;
  do {
    do {
      while( true ) {
        lVar3 = std::chrono::_V2::system_clock::now();
        lVar5 = *(long *)(p_Var1 + 1);
        if (lVar3 < lVar5) break;
        if (*(int *)&local_2b0._M_left[1]._M_parent == 1) {
          value = value + (int)local_2e8;
          if (iVar8 <= value) {
            value = iVar8;
          }
          if ((int)local_2e8 == 0) {
            value = iVar8;
          }
          backlight_adjuster::set_brightness(&local_2d0,value);
          if (value != iVar8) {
            lVar5 = std::chrono::_V2::system_clock::now();
            local_2f8.tv_sec = (DAT_00107220 / DAT_00107228) * 1000000 + lVar5;
            local_2fc = BACKLIGHT_FADE;
            std::
            _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
            ::
            _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                      (local_2b8,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
                        *)&local_2f8,&local_2fc);
          }
        }
        else if (*(int *)&local_2b0._M_left[1]._M_parent == 0) {
          memmove(&local_288.values_,local_288.values_._M_elems + 1,0x48);
          local_288.values_._M_elems[9] = ambient_light::read_value(&local_288);
          local_2e0 = 0.0;
          lVar5 = -0x50;
          do {
            local_2e0 = local_2e0 + *(double *)(&stack0xffffffffffffffd0 + lVar5);
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0);
          local_2e0 = local_2e0 / 10.0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[info]: Ambient light value was ",0x20);
          poVar6 = std::ostream::_M_insert<double>(local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          value = backlight_adjuster::current_brightness(&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[info]: current brightness ",0x1b);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,value);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          local_2d8 = (double)local_2d0.max_bright_;
          dVar9 = log(local_2e0 * 100.0 + 1.0);
          iVar8 = (int)((dVar9 * local_2d8) / 4.61512051684126);
          if (iVar8 < _DAT_00107254) {
            iVar8 = _DAT_00107254;
          }
          if (iVar8 - value != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[info]: Adjusting brightness to ",0x20);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            local_2e8 = (ulong)(long)(iVar8 - value) / DAT_00107228;
            uVar7 = 0;
            do {
              lVar5 = std::chrono::_V2::system_clock::now();
              local_2f8.tv_sec = ((DAT_00107220 * uVar7) / DAT_00107228) * 1000000 + lVar5;
              local_2fc = BACKLIGHT_FADE;
              std::
              _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
              ::
              _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                        (local_2b8,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
                          *)&local_2f8,&local_2fc);
              uVar7 = uVar7 + 1;
            } while (uVar7 < DAT_00107228);
          }
          lVar5 = std::chrono::_V2::system_clock::now();
          local_2f8.tv_sec = config * 1000000 + lVar5;
          local_2fc = BACKLIGHT_POLL;
          std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
          ::
          _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
                    (local_2b8,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_2f8,&local_2fc);
        }
        std::
        _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
        ::erase_abi_cxx11_(local_2b8,(iterator)local_2b0._M_left);
        p_Var1 = local_2b0._M_left;
      }
      uVar7 = lVar5 - lVar3;
    } while (uVar7 == 0 || lVar5 < lVar3);
    local_2f8.tv_sec = uVar7 / 1000000000;
    local_2f8.tv_nsec = uVar7 % 1000000000;
    do {
      iVar2 = nanosleep(&local_2f8,&local_2f8);
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  } while( true );
}

Assistant:

void loop()
{
    backlight_adjuster adjuster;
    ambient_light sensor{config.light_sensor};

    using steady_clock = std::chrono::system_clock;
    std::multimap<steady_clock::time_point, action_type> timer_queue;
    timer_queue.emplace(steady_clock::now(), action_type::BACKLIGHT_POLL);

    int32_t curr_bright = 0;
    int32_t new_bright = 0;
    int32_t step_size = 0;

    while (true)
    {
        std::this_thread::sleep_until(timer_queue.begin()->first);
        if (timer_queue.begin()->second == action_type::BACKLIGHT_POLL)
        {
            // read the current ambient light value
            auto ambient_light = sensor.poll();
            std::cerr << "[info]: Ambient light value was " << ambient_light
                      << "\n";

            // read the current backlight value
            curr_bright = adjuster.current_brightness();
            std::cerr << "[info]: current brightness " << curr_bright << "\n";

            // calculate the new brightness value
            new_bright = config.desired_brightness(adjuster.max_brightness(),
                                                   ambient_light);

            new_bright = std::max(new_bright, config.min_bright);

            if (curr_bright != new_bright)
            {
                std::cerr << "[info]: Adjusting brightness to " << new_bright
                          << "\n";
                step_size = (new_bright - curr_bright) / config.fade_steps;
                for (std::size_t i = 0; i < config.fade_steps; ++i)
                {
                    timer_queue.emplace(steady_clock::now()
                                            + i * config.fade_time
                                                  / config.fade_steps,
                                        action_type::BACKLIGHT_FADE);
                }
            }
            timer_queue.emplace(steady_clock::now() + config.poll_time,
                                action_type::BACKLIGHT_POLL);
        }
        else if (timer_queue.begin()->second == action_type::BACKLIGHT_FADE)
        {
            curr_bright += step_size;
            if (step_size == 0 || curr_bright > new_bright)
                curr_bright = new_bright;

            adjuster.set_brightness(curr_bright);
            if (curr_bright != new_bright)
            {
                timer_queue.emplace(steady_clock::now()
                                        + config.fade_time / config.fade_steps,
                                    action_type::BACKLIGHT_FADE);
            }
        }
        timer_queue.erase(timer_queue.begin());
    }
}